

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::SubGridIntersector1Moeller<4,_true>_>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  float *pfVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  ushort uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  RTCIntersectArguments *pRVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte bVar28;
  byte bVar29;
  int iVar30;
  undefined4 uVar31;
  ulong *puVar32;
  RTCRayQueryContext *pRVar33;
  undefined4 uVar34;
  ulong uVar35;
  long lVar36;
  RTCRayQueryContext *pRVar37;
  undefined8 uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  int iVar48;
  int iVar49;
  float fVar50;
  uint uVar51;
  float fVar52;
  float fVar57;
  float fVar59;
  float fVar60;
  float fVar62;
  vint4 ai;
  undefined1 auVar53 [16];
  uint uVar58;
  uint uVar61;
  float fVar63;
  uint uVar64;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar65;
  float fVar66;
  byte bVar67;
  float fVar68;
  byte bVar72;
  byte bVar73;
  byte bVar75;
  float fVar76;
  byte bVar78;
  byte bVar79;
  float fVar80;
  vint4 ai_1;
  uint uVar69;
  byte bVar74;
  uint uVar77;
  uint uVar81;
  float fVar82;
  uint uVar83;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  uint uVar84;
  float fVar85;
  float fVar92;
  float fVar94;
  undefined1 auVar86 [12];
  uint uVar91;
  vint4 ai_2;
  undefined1 auVar87 [16];
  uint uVar93;
  uint uVar95;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar96;
  float fVar97;
  uint uVar98;
  float fVar103;
  float fVar105;
  vint4 ai_3;
  uint uVar104;
  uint uVar106;
  float fVar107;
  float fVar108;
  uint uVar109;
  float fVar110;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar111;
  float fVar112;
  float fVar117;
  float fVar118;
  vint4 bi_2;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar119;
  float fVar122;
  float fVar124;
  vint4 bi_3;
  undefined1 auVar120 [16];
  float fVar123;
  float fVar125;
  float fVar126;
  undefined1 auVar121 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_b7c;
  ulong *local_b78;
  Ray *local_b70;
  RayQueryContext *local_b68;
  ulong local_b60;
  undefined8 local_b58;
  float fStack_b50;
  float fStack_b4c;
  float local_b48;
  undefined4 local_b44;
  undefined4 local_b40;
  undefined4 local_b3c;
  float local_b38;
  undefined4 local_b34;
  undefined4 local_b30;
  uint local_b2c;
  uint local_b28;
  RTCFilterFunctionNArguments local_b18;
  undefined1 local_ae8 [8];
  float fStack_ae0;
  float fStack_adc;
  undefined8 local_ad8;
  float fStack_ad0;
  float fStack_acc;
  ulong local_ac0;
  long local_ab8;
  Scene *local_ab0;
  undefined8 local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  undefined8 local_a98;
  float fStack_a90;
  float fStack_a8c;
  undefined1 local_a88 [8];
  float fStack_a80;
  float fStack_a7c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  ulong local_a50;
  ulong local_a48;
  ulong local_a40;
  ulong local_a38;
  ulong local_a30;
  ulong local_a28;
  ulong local_a20;
  ulong local_a18;
  ulong local_a10;
  ulong local_a08;
  ulong local_a00;
  long local_9f8;
  long local_9f0;
  ulong local_9e8;
  long local_9e0;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  undefined1 local_998 [16];
  undefined1 local_988 [8];
  float fStack_980;
  float fStack_97c;
  undefined1 local_978 [8];
  float fStack_970;
  float fStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  undefined1 local_958 [8];
  float fStack_950;
  float fStack_94c;
  undefined1 local_938 [16];
  undefined1 local_928 [8];
  float fStack_920;
  float fStack_91c;
  undefined1 local_918 [8];
  float fStack_910;
  float fStack_90c;
  float local_908 [4];
  float local_8f8 [4];
  undefined1 local_8e8 [8];
  float fStack_8e0;
  float fStack_8dc;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined1 local_8c8 [16];
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  undefined8 local_818;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  ulong local_7d8 [245];
  
  local_b68 = context;
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8[0] != 8) && (fVar119 = ray->tfar, 0.0 <= fVar119)) {
    local_b78 = local_7d8 + 1;
    fVar85 = (ray->org).field_0.m128[0];
    fVar92 = (ray->org).field_0.m128[1];
    fVar123 = (ray->org).field_0.m128[2];
    fVar126 = *(float *)((long)&(ray->org).field_0 + 0xc);
    aVar7 = (ray->dir).field_0.field_1;
    auVar53._4_4_ = -(uint)(ABS(aVar7.y) < DAT_01f4bd50._4_4_);
    auVar53._0_4_ = -(uint)(ABS(aVar7.x) < (float)DAT_01f4bd50);
    auVar53._8_4_ = -(uint)(ABS(aVar7.z) < DAT_01f4bd50._8_4_);
    auVar53._12_4_ = -(uint)(ABS(aVar7.field_3.w) < DAT_01f4bd50._12_4_);
    auVar87 = blendvps((undefined1  [16])aVar7,_DAT_01f4bd50,auVar53);
    fVar144 = 0.0;
    if (0.0 <= fVar126) {
      fVar144 = fVar126;
    }
    auVar53 = rcpps(auVar53,auVar87);
    fVar111 = auVar53._0_4_;
    fVar117 = auVar53._4_4_;
    fVar118 = auVar53._8_4_;
    fVar111 = (1.0 - auVar87._0_4_ * fVar111) * fVar111 + fVar111;
    fVar117 = (1.0 - auVar87._4_4_ * fVar117) * fVar117 + fVar117;
    fVar118 = (1.0 - auVar87._8_4_ * fVar118) * fVar118 + fVar118;
    uVar45 = (ulong)(fVar111 < 0.0) << 4;
    uVar41 = (ulong)(fVar117 < 0.0) << 4 | 0x20;
    uVar42 = (ulong)(fVar118 < 0.0) << 4 | 0x40;
    uVar43 = uVar45 ^ 0x10;
    uVar39 = uVar41 ^ 0x10;
    uVar46 = uVar42 ^ 0x10;
    local_a00 = (ulong)(((uint)(fVar111 < 0.0) << 4) >> 2);
    local_a08 = uVar43 >> 2;
    local_a10 = uVar41 >> 2;
    local_a18 = uVar39 >> 2;
    local_a20 = uVar42 >> 2;
    local_a28 = uVar46 >> 2;
    local_998 = mm_lookupmask_ps._240_16_;
    local_b70 = ray;
    local_858 = fVar119;
    fStack_854 = fVar119;
    fStack_850 = fVar119;
    fStack_84c = fVar119;
    local_868 = fVar123;
    fStack_864 = fVar123;
    fStack_860 = fVar123;
    fStack_85c = fVar123;
    local_878 = fVar144;
    fStack_874 = fVar144;
    fStack_870 = fVar144;
    fStack_86c = fVar144;
    local_888 = fVar118;
    fStack_884 = fVar118;
    fStack_880 = fVar118;
    fStack_87c = fVar118;
    local_898 = fVar85;
    fStack_894 = fVar85;
    fStack_890 = fVar85;
    fStack_88c = fVar85;
    local_8a8 = fVar92;
    fStack_8a4 = fVar92;
    fStack_8a0 = fVar92;
    fStack_89c = fVar92;
    local_a30 = uVar45;
    local_8b8 = fVar111;
    fStack_8b4 = fVar111;
    fStack_8b0 = fVar111;
    fStack_8ac = fVar111;
    local_828 = fVar117;
    fStack_824 = fVar117;
    fStack_820 = fVar117;
    fStack_81c = fVar117;
    local_a38 = uVar41;
    local_a40 = uVar42;
    local_a48 = uVar43;
    local_a50 = uVar39;
    local_9e8 = uVar46;
    fVar126 = fVar144;
    fVar112 = fVar144;
    fVar52 = fVar144;
    fVar94 = fVar92;
    fVar96 = fVar92;
    fVar66 = fVar92;
    fVar59 = fVar111;
    fVar62 = fVar111;
    fVar65 = fVar111;
    fVar127 = fVar117;
    fVar128 = fVar117;
    fVar129 = fVar117;
    fVar122 = fVar118;
    fVar124 = fVar118;
    fVar125 = fVar118;
    fVar134 = fVar119;
    fVar135 = fVar119;
    fVar136 = fVar119;
    fVar137 = fVar123;
    fVar138 = fVar123;
    fVar139 = fVar123;
    fVar140 = fVar85;
    fVar141 = fVar85;
    fVar142 = fVar85;
LAB_006b26f3:
    puVar32 = local_7d8;
    if (local_b78 != puVar32) {
      uVar44 = local_b78[-1];
      local_b78 = local_b78 + -1;
      while ((uVar44 & 8) == 0) {
        pfVar6 = (float *)(uVar44 + 0x20 + uVar45);
        fVar50 = (*pfVar6 - fVar85) * fVar111;
        fVar57 = (pfVar6[1] - fVar140) * fVar59;
        fVar60 = (pfVar6[2] - fVar141) * fVar62;
        fVar63 = (pfVar6[3] - fVar142) * fVar65;
        pfVar6 = (float *)(uVar44 + 0x20 + uVar41);
        fVar68 = (*pfVar6 - fVar92) * fVar117;
        fVar76 = (pfVar6[1] - fVar94) * fVar127;
        fVar80 = (pfVar6[2] - fVar96) * fVar128;
        fVar82 = (pfVar6[3] - fVar66) * fVar129;
        uVar69 = (uint)((int)fVar68 < (int)fVar50) * (int)fVar50 |
                 (uint)((int)fVar68 >= (int)fVar50) * (int)fVar68;
        uVar77 = (uint)((int)fVar76 < (int)fVar57) * (int)fVar57 |
                 (uint)((int)fVar76 >= (int)fVar57) * (int)fVar76;
        uVar81 = (uint)((int)fVar80 < (int)fVar60) * (int)fVar60 |
                 (uint)((int)fVar80 >= (int)fVar60) * (int)fVar80;
        uVar83 = (uint)((int)fVar82 < (int)fVar63) * (int)fVar63 |
                 (uint)((int)fVar82 >= (int)fVar63) * (int)fVar82;
        pfVar6 = (float *)(uVar44 + 0x20 + uVar42);
        fVar50 = (*pfVar6 - fVar123) * fVar118;
        fVar57 = (pfVar6[1] - fVar137) * fVar122;
        fVar60 = (pfVar6[2] - fVar138) * fVar124;
        fVar63 = (pfVar6[3] - fVar139) * fVar125;
        pfVar6 = (float *)(uVar44 + 0x20 + uVar43);
        fVar68 = (*pfVar6 - fVar85) * fVar111;
        fVar76 = (pfVar6[1] - fVar140) * fVar59;
        fVar80 = (pfVar6[2] - fVar141) * fVar62;
        fVar82 = (pfVar6[3] - fVar142) * fVar65;
        pfVar6 = (float *)(uVar44 + 0x20 + uVar39);
        fVar97 = (*pfVar6 - fVar92) * fVar117;
        fVar103 = (pfVar6[1] - fVar94) * fVar127;
        fVar105 = (pfVar6[2] - fVar96) * fVar128;
        fVar108 = (pfVar6[3] - fVar66) * fVar129;
        uVar98 = (uint)((int)fVar68 < (int)fVar97) * (int)fVar68 |
                 (uint)((int)fVar68 >= (int)fVar97) * (int)fVar97;
        uVar104 = (uint)((int)fVar76 < (int)fVar103) * (int)fVar76 |
                  (uint)((int)fVar76 >= (int)fVar103) * (int)fVar103;
        uVar106 = (uint)((int)fVar80 < (int)fVar105) * (int)fVar80 |
                  (uint)((int)fVar80 >= (int)fVar105) * (int)fVar105;
        uVar109 = (uint)((int)fVar82 < (int)fVar108) * (int)fVar82 |
                  (uint)((int)fVar82 >= (int)fVar108) * (int)fVar108;
        pfVar6 = (float *)(uVar44 + 0x20 + uVar46);
        fVar68 = (*pfVar6 - fVar123) * fVar118;
        fVar76 = (pfVar6[1] - fVar137) * fVar122;
        fVar80 = (pfVar6[2] - fVar138) * fVar124;
        fVar82 = (pfVar6[3] - fVar139) * fVar125;
        uVar51 = (uint)((int)fVar50 < (int)fVar144) * (int)fVar144 |
                 (uint)((int)fVar50 >= (int)fVar144) * (int)fVar50;
        uVar58 = (uint)((int)fVar57 < (int)fVar126) * (int)fVar126 |
                 (uint)((int)fVar57 >= (int)fVar126) * (int)fVar57;
        uVar61 = (uint)((int)fVar60 < (int)fVar112) * (int)fVar112 |
                 (uint)((int)fVar60 >= (int)fVar112) * (int)fVar60;
        uVar64 = (uint)((int)fVar63 < (int)fVar52) * (int)fVar52 |
                 (uint)((int)fVar63 >= (int)fVar52) * (int)fVar63;
        uVar84 = (uint)((int)fVar119 < (int)fVar68) * (int)fVar119 |
                 (uint)((int)fVar119 >= (int)fVar68) * (int)fVar68;
        uVar91 = (uint)((int)fVar134 < (int)fVar76) * (int)fVar134 |
                 (uint)((int)fVar134 >= (int)fVar76) * (int)fVar76;
        uVar93 = (uint)((int)fVar135 < (int)fVar80) * (int)fVar135 |
                 (uint)((int)fVar135 >= (int)fVar80) * (int)fVar80;
        uVar95 = (uint)((int)fVar136 < (int)fVar82) * (int)fVar136 |
                 (uint)((int)fVar136 >= (int)fVar82) * (int)fVar82;
        auVar87._0_4_ =
             -(uint)((int)(((int)uVar98 < (int)uVar84) * uVar98 |
                          ((int)uVar98 >= (int)uVar84) * uVar84) <
                    (int)(((int)uVar51 < (int)uVar69) * uVar69 |
                         ((int)uVar51 >= (int)uVar69) * uVar51));
        auVar87._4_4_ =
             -(uint)((int)(((int)uVar104 < (int)uVar91) * uVar104 |
                          ((int)uVar104 >= (int)uVar91) * uVar91) <
                    (int)(((int)uVar58 < (int)uVar77) * uVar77 |
                         ((int)uVar58 >= (int)uVar77) * uVar58));
        auVar87._8_4_ =
             -(uint)((int)(((int)uVar106 < (int)uVar93) * uVar106 |
                          ((int)uVar106 >= (int)uVar93) * uVar93) <
                    (int)(((int)uVar61 < (int)uVar81) * uVar81 |
                         ((int)uVar61 >= (int)uVar81) * uVar61));
        auVar87._12_4_ =
             -(uint)((int)(((int)uVar109 < (int)uVar95) * uVar109 |
                          ((int)uVar109 >= (int)uVar95) * uVar95) <
                    (int)(((int)uVar64 < (int)uVar83) * uVar83 |
                         ((int)uVar64 >= (int)uVar83) * uVar64));
        iVar30 = movmskps((int)puVar32,auVar87);
        if (iVar30 == 0xf) goto LAB_006b26f3;
        bVar29 = (byte)iVar30 ^ 0xf;
        puVar32 = (ulong *)(uVar44 & 0xfffffffffffffff0);
        lVar36 = 0;
        if (bVar29 != 0) {
          for (; (bVar29 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
          }
        }
        uVar44 = puVar32[lVar36];
        uVar51 = bVar29 - 1 & (uint)bVar29;
        uVar35 = (ulong)uVar51;
        if (uVar51 != 0) {
          do {
            *local_b78 = uVar44;
            local_b78 = local_b78 + 1;
            lVar36 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
              }
            }
            uVar44 = puVar32[lVar36];
            uVar35 = uVar35 - 1 & uVar35;
          } while (uVar35 != 0);
        }
      }
      local_9f8 = (ulong)((uint)uVar44 & 0xf) - 8;
      uVar44 = uVar44 & 0xfffffffffffffff0;
      for (local_9f0 = 0; local_9f0 != local_9f8; local_9f0 = local_9f0 + 1) {
        lVar36 = local_9f0 * 0x58;
        local_9e0 = uVar44 + lVar36;
        uVar39 = *(ulong *)(uVar44 + 0x20 + lVar36);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar39;
        uVar38 = *(undefined8 *)(uVar44 + 0x24 + lVar36);
        bVar29 = (byte)uVar39;
        bVar67 = (byte)uVar38;
        bVar18 = (byte)(uVar39 >> 8);
        bVar72 = (byte)((ulong)uVar38 >> 8);
        bVar19 = (byte)(uVar39 >> 0x10);
        bVar73 = (byte)((ulong)uVar38 >> 0x10);
        bVar20 = (byte)(uVar39 >> 0x18);
        bVar74 = (byte)((ulong)uVar38 >> 0x18);
        bVar21 = (byte)(uVar39 >> 0x20);
        bVar75 = (byte)((ulong)uVar38 >> 0x20);
        bVar22 = (byte)(uVar39 >> 0x28);
        bVar78 = (byte)((ulong)uVar38 >> 0x28);
        bVar23 = (byte)(uVar39 >> 0x30);
        bVar79 = (byte)((ulong)uVar38 >> 0x30);
        bVar28 = (byte)((ulong)uVar38 >> 0x38);
        bVar24 = (byte)(uVar39 >> 0x38);
        auVar70[0] = -((byte)((bVar29 < bVar67) * bVar29 | (bVar29 >= bVar67) * bVar67) == bVar29);
        auVar70[1] = -((byte)((bVar18 < bVar72) * bVar18 | (bVar18 >= bVar72) * bVar72) == bVar18);
        auVar70[2] = -((byte)((bVar19 < bVar73) * bVar19 | (bVar19 >= bVar73) * bVar73) == bVar19);
        auVar70[3] = -((byte)((bVar20 < bVar74) * bVar20 | (bVar20 >= bVar74) * bVar74) == bVar20);
        auVar70[4] = -((byte)((bVar21 < bVar75) * bVar21 | (bVar21 >= bVar75) * bVar75) == bVar21);
        auVar70[5] = -((byte)((bVar22 < bVar78) * bVar22 | (bVar22 >= bVar78) * bVar78) == bVar22);
        auVar70[6] = -((byte)((bVar23 < bVar79) * bVar23 | (bVar23 >= bVar79) * bVar79) == bVar23);
        auVar70[7] = -((byte)((bVar24 < bVar28) * bVar24 | (bVar24 >= bVar28) * bVar28) == bVar24);
        auVar70[8] = 0xff;
        auVar70[9] = 0xff;
        auVar70[10] = 0xff;
        auVar70[0xb] = 0xff;
        auVar70[0xc] = 0xff;
        auVar70[0xd] = 0xff;
        auVar70[0xe] = 0xff;
        auVar70[0xf] = 0xff;
        auVar88._8_4_ = 0xffffffff;
        auVar88._0_8_ = 0xffffffffffffffff;
        auVar88._12_4_ = 0xffffffff;
        auVar53 = pmovzxbd(auVar54,auVar70 ^ auVar88);
        auVar53 = auVar53 ^ auVar88;
        auVar90._0_4_ = auVar53._0_4_ << 0x1f;
        auVar90._4_4_ = auVar53._4_4_ << 0x1f;
        auVar90._8_4_ = auVar53._8_4_ << 0x1f;
        auVar90._12_4_ = auVar53._12_4_ << 0x1f;
        uVar31 = movmskps((int)local_9f0,auVar90);
        fVar50 = *(float *)(uVar44 + 0x38 + lVar36);
        fVar57 = *(float *)(uVar44 + 0x3c + lVar36);
        fVar60 = *(float *)(uVar44 + 0x44 + lVar36);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)(local_a00 + 0x20 + local_9e0);
        auVar53 = pmovzxbd(auVar55,auVar55);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)(local_a08 + 0x20 + local_9e0);
        auVar87 = pmovzxbd(auVar56,auVar56);
        fVar63 = *(float *)(uVar44 + 0x48 + lVar36);
        auVar71._8_8_ = 0;
        auVar71._0_8_ = *(ulong *)(local_a10 + 0x20 + local_9e0);
        auVar54 = pmovzxbd(auVar71,auVar71);
        auVar89._8_8_ = 0;
        auVar89._0_8_ = *(ulong *)(local_a18 + 0x20 + local_9e0);
        auVar90 = pmovzxbd(auVar89,auVar89);
        fVar68 = *(float *)(uVar44 + 0x4c + lVar36);
        auVar113._8_8_ = 0;
        auVar113._0_8_ = *(ulong *)(local_a20 + 0x20 + local_9e0);
        auVar55 = pmovzxbd(auVar113,auVar113);
        auVar120._8_8_ = 0;
        auVar120._0_8_ = *(ulong *)(local_a28 + 0x20 + local_9e0);
        auVar56 = pmovzxbd(auVar120,auVar120);
        fVar76 = *(float *)(uVar44 + 0x40 + lVar36);
        fVar105 = (((float)auVar53._0_4_ * fVar60 + fVar50) - fVar85) * fVar111;
        fVar108 = (((float)auVar53._4_4_ * fVar60 + fVar50) - fVar140) * fVar59;
        fVar107 = (((float)auVar53._8_4_ * fVar60 + fVar50) - fVar141) * fVar62;
        fVar110 = (((float)auVar53._12_4_ * fVar60 + fVar50) - fVar142) * fVar65;
        fVar80 = (((float)auVar54._0_4_ * fVar63 + fVar57) - fVar92) * fVar117;
        fVar82 = (((float)auVar54._4_4_ * fVar63 + fVar57) - fVar94) * fVar127;
        fVar97 = (((float)auVar54._8_4_ * fVar63 + fVar57) - fVar96) * fVar128;
        fVar103 = (((float)auVar54._12_4_ * fVar63 + fVar57) - fVar66) * fVar129;
        uVar51 = (uint)((int)fVar80 < (int)fVar105) * (int)fVar105 |
                 (uint)((int)fVar80 >= (int)fVar105) * (int)fVar80;
        uVar58 = (uint)((int)fVar82 < (int)fVar108) * (int)fVar108 |
                 (uint)((int)fVar82 >= (int)fVar108) * (int)fVar82;
        uVar61 = (uint)((int)fVar97 < (int)fVar107) * (int)fVar107 |
                 (uint)((int)fVar97 >= (int)fVar107) * (int)fVar97;
        uVar64 = (uint)((int)fVar103 < (int)fVar110) * (int)fVar110 |
                 (uint)((int)fVar103 >= (int)fVar110) * (int)fVar103;
        fVar111 = (((float)auVar87._0_4_ * fVar60 + fVar50) - fVar85) * fVar111;
        fVar59 = (((float)auVar87._4_4_ * fVar60 + fVar50) - fVar140) * fVar59;
        fVar62 = (((float)auVar87._8_4_ * fVar60 + fVar50) - fVar141) * fVar62;
        fVar65 = (((float)auVar87._12_4_ * fVar60 + fVar50) - fVar142) * fVar65;
        fVar85 = (((float)auVar90._0_4_ * fVar63 + fVar57) - fVar92) * fVar117;
        fVar92 = (((float)auVar90._4_4_ * fVar63 + fVar57) - fVar94) * fVar127;
        fVar94 = (((float)auVar90._8_4_ * fVar63 + fVar57) - fVar96) * fVar128;
        fVar96 = (((float)auVar90._12_4_ * fVar63 + fVar57) - fVar66) * fVar129;
        uVar69 = (uint)((int)fVar111 < (int)fVar85) * (int)fVar111 |
                 (uint)((int)fVar111 >= (int)fVar85) * (int)fVar85;
        uVar77 = (uint)((int)fVar59 < (int)fVar92) * (int)fVar59 |
                 (uint)((int)fVar59 >= (int)fVar92) * (int)fVar92;
        uVar81 = (uint)((int)fVar62 < (int)fVar94) * (int)fVar62 |
                 (uint)((int)fVar62 >= (int)fVar94) * (int)fVar94;
        uVar83 = (uint)((int)fVar65 < (int)fVar96) * (int)fVar65 |
                 (uint)((int)fVar65 >= (int)fVar96) * (int)fVar96;
        fVar85 = (((float)auVar55._0_4_ * fVar68 + fVar76) - fVar123) * fVar118;
        fVar92 = (((float)auVar55._4_4_ * fVar68 + fVar76) - fVar137) * fVar122;
        fVar94 = (((float)auVar55._8_4_ * fVar68 + fVar76) - fVar138) * fVar124;
        fVar96 = (((float)auVar55._12_4_ * fVar68 + fVar76) - fVar139) * fVar125;
        uVar84 = (uint)((int)fVar85 < (int)fVar144) * (int)fVar144 |
                 (uint)((int)fVar85 >= (int)fVar144) * (int)fVar85;
        uVar91 = (uint)((int)fVar92 < (int)fVar126) * (int)fVar126 |
                 (uint)((int)fVar92 >= (int)fVar126) * (int)fVar92;
        uVar93 = (uint)((int)fVar94 < (int)fVar112) * (int)fVar112 |
                 (uint)((int)fVar94 >= (int)fVar112) * (int)fVar94;
        uVar95 = (uint)((int)fVar96 < (int)fVar52) * (int)fVar52 |
                 (uint)((int)fVar96 >= (int)fVar52) * (int)fVar96;
        fVar118 = (((float)auVar56._0_4_ * fVar68 + fVar76) - fVar123) * fVar118;
        fVar122 = (((float)auVar56._4_4_ * fVar68 + fVar76) - fVar137) * fVar122;
        fVar124 = (((float)auVar56._8_4_ * fVar68 + fVar76) - fVar138) * fVar124;
        fVar125 = (((float)auVar56._12_4_ * fVar68 + fVar76) - fVar139) * fVar125;
        uVar98 = (uint)((int)fVar119 < (int)fVar118) * (int)fVar119 |
                 (uint)((int)fVar119 >= (int)fVar118) * (int)fVar118;
        uVar104 = (uint)((int)fVar134 < (int)fVar122) * (int)fVar134 |
                  (uint)((int)fVar134 >= (int)fVar122) * (int)fVar122;
        uVar106 = (uint)((int)fVar135 < (int)fVar124) * (int)fVar135 |
                  (uint)((int)fVar135 >= (int)fVar124) * (int)fVar124;
        uVar109 = (uint)((int)fVar136 < (int)fVar125) * (int)fVar136 |
                  (uint)((int)fVar136 >= (int)fVar125) * (int)fVar125;
        auVar114._0_4_ =
             -(uint)((int)(((int)uVar69 < (int)uVar98) * uVar69 |
                          ((int)uVar69 >= (int)uVar98) * uVar98) <
                    (int)(((int)uVar84 < (int)uVar51) * uVar51 |
                         ((int)uVar84 >= (int)uVar51) * uVar84));
        auVar114._4_4_ =
             -(uint)((int)(((int)uVar77 < (int)uVar104) * uVar77 |
                          ((int)uVar77 >= (int)uVar104) * uVar104) <
                    (int)(((int)uVar91 < (int)uVar58) * uVar58 |
                         ((int)uVar91 >= (int)uVar58) * uVar91));
        auVar114._8_4_ =
             -(uint)((int)(((int)uVar81 < (int)uVar106) * uVar81 |
                          ((int)uVar81 >= (int)uVar106) * uVar106) <
                    (int)(((int)uVar93 < (int)uVar61) * uVar61 |
                         ((int)uVar93 >= (int)uVar61) * uVar93));
        auVar114._12_4_ =
             -(uint)((int)(((int)uVar83 < (int)uVar109) * uVar83 |
                          ((int)uVar83 >= (int)uVar109) * uVar109) <
                    (int)(((int)uVar95 < (int)uVar64) * uVar64 |
                         ((int)uVar95 >= (int)uVar64) * uVar95));
        uVar34 = movmskps((int)lVar36,auVar114);
        for (uVar39 = (ulong)(byte)(~(byte)uVar34 & (byte)uVar31); auVar53 = _local_ae8, uVar39 != 0
            ; uVar39 = uVar39 & uVar39 - 1) {
          lVar36 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
            }
          }
          uVar10 = *(ushort *)(local_9e0 + lVar36 * 8);
          uVar11 = *(ushort *)(local_9e0 + 2 + lVar36 * 8);
          local_b60 = (ulong)*(uint *)(local_9e0 + 0x50);
          local_ac0 = (ulong)*(uint *)(local_9e0 + 4 + lVar36 * 8);
          local_ab0 = local_b68->scene;
          pGVar12 = (local_ab0->geometries).items[local_b60].ptr;
          local_ab8 = *(long *)&pGVar12->field_0x58;
          pRVar33 = *(RTCRayQueryContext **)&pGVar12[1].time_range.upper;
          lVar36 = local_ac0 *
                   pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar58 = uVar10 & 0x7fff;
          uVar61 = uVar11 & 0x7fff;
          uVar51 = *(uint *)(local_ab8 + 4 + lVar36);
          uVar42 = (ulong)uVar51;
          uVar41 = (ulong)(uVar51 * uVar61 + *(int *)(local_ab8 + lVar36) + uVar58);
          p_Var13 = pGVar12[1].intersectionFilterN;
          puVar1 = (uint *)((long)pRVar33->instID + (long)p_Var13 * uVar41);
          fVar119 = (float)*puVar1;
          fVar85 = (float)puVar1[1];
          fVar92 = (float)puVar1[2];
          puVar1 = (uint *)((long)pRVar33->instID + (uVar41 + 1) * (long)p_Var13);
          fVar123 = (float)*puVar1;
          local_7e8 = (float)puVar1[1];
          local_ae8._0_4_ = puVar1[2];
          puVar1 = (uint *)((long)pRVar33->instID + (uVar41 + uVar42) * (long)p_Var13);
          fVar126 = (float)*puVar1;
          fVar144 = (float)puVar1[1];
          local_a68 = (float)puVar1[2];
          lVar47 = uVar41 + uVar42 + 1;
          puVar1 = (uint *)((long)pRVar33->instID + lVar47 * (long)p_Var13);
          fVar112 = (float)*puVar1;
          fStack_7dc = (float)puVar1[1];
          fStack_ad0 = (float)puVar1[2];
          uVar45 = (ulong)(-1 < (short)uVar10);
          puVar2 = (uint *)((long)pRVar33->instID + (uVar41 + uVar45 + 1) * (long)p_Var13);
          lVar40 = uVar45 + lVar47;
          puVar3 = (uint *)((long)pRVar33->instID + lVar40 * (long)p_Var13);
          fStack_a74 = (float)puVar3[1];
          fStack_a70 = (float)puVar3[2];
          uVar45 = 0;
          if (-1 < (short)uVar11) {
            uVar45 = uVar42;
          }
          puVar4 = (uint *)((long)pRVar33->instID + (uVar41 + uVar42 + uVar45) * (long)p_Var13);
          puVar5 = (uint *)((long)pRVar33->instID + (lVar47 + uVar45) * (long)p_Var13);
          local_7f8 = (float)*puVar5;
          fStack_7f4 = (float)puVar5[1];
          fStack_7f0 = (float)puVar5[2];
          local_a78 = (float)*puVar3;
          fStack_a6c = (float)puVar3[3];
          local_ae8._4_4_ = puVar2[2];
          fStack_7ec = (float)puVar5[3];
          fStack_acc = (float)puVar1[3];
          fStack_7e4 = (float)puVar2[1];
          fStack_7e0 = fStack_a74;
          fVar52 = fVar85 - local_7e8;
          fVar94 = local_7e8 - (float)puVar2[1];
          fVar96 = fStack_7dc - fStack_a74;
          fVar66 = fVar144 - fStack_7dc;
          _fStack_ae0 = auVar53._8_8_;
          local_ad8._0_4_ = fStack_a70;
          local_ad8._4_4_ = fStack_ad0;
          fVar146 = fVar92 - (float)local_ae8._0_4_;
          fVar148 = (float)local_ae8._0_4_ - (float)puVar2[2];
          fVar150 = fStack_ad0 - fStack_a70;
          fVar152 = local_a68 - fStack_ad0;
          fStack_800 = fStack_7f4;
          fStack_7fc = (float)puVar4[1];
          fVar141 = fVar144 - fVar85;
          fVar142 = fStack_7dc - local_7e8;
          fVar50 = fStack_7f4 - fStack_7dc;
          fVar57 = (float)puVar4[1] - fVar144;
          fStack_a64 = fStack_ad0;
          fStack_a60 = fStack_7f0;
          fStack_a5c = (float)puVar4[2];
          fVar80 = local_a68 - fVar92;
          fVar82 = fStack_ad0 - (float)local_ae8._0_4_;
          fVar97 = fStack_7f0 - fStack_ad0;
          fVar103 = (float)puVar4[2] - local_a68;
          local_8f8[0] = fVar146 * fVar141 - fVar52 * fVar80;
          local_8f8[1] = fVar148 * fVar142 - fVar94 * fVar82;
          local_8f8[2] = fVar150 * fVar50 - fVar96 * fVar97;
          local_8f8[3] = fVar152 * fVar57 - fVar66 * fVar103;
          local_818 = CONCAT44(fVar112,fVar126);
          local_808 = local_7f8;
          fStack_804 = (float)*puVar4;
          fVar122 = fVar126 - fVar119;
          fVar124 = fVar112 - fVar123;
          fVar125 = local_7f8 - fVar112;
          fVar118 = (float)*puVar4 - fVar126;
          local_9b8 = (local_b70->org).field_0.m128[0];
          local_9c8 = (local_b70->org).field_0.m128[1];
          local_9a8 = (local_b70->org).field_0.m128[2];
          local_aa8._0_4_ = (local_b70->dir).field_0.m128[0];
          local_9d8 = (local_b70->dir).field_0.m128[1];
          local_b58._0_4_ = (local_b70->dir).field_0.m128[2];
          fStack_9b4 = local_9b8;
          fStack_9b0 = local_9b8;
          fStack_9ac = local_9b8;
          local_a88._0_4_ = fVar119 - local_9b8;
          local_a88._4_4_ = fVar123 - local_9b8;
          fStack_a80 = fVar112 - local_9b8;
          fStack_a7c = fVar126 - local_9b8;
          fStack_9c4 = local_9c8;
          fStack_9c0 = local_9c8;
          fStack_9bc = local_9c8;
          fVar85 = fVar85 - local_9c8;
          fVar108 = local_7e8 - local_9c8;
          fVar110 = fStack_7dc - local_9c8;
          fVar144 = fVar144 - local_9c8;
          fVar134 = (float)local_a88._0_4_ * local_9d8 - fVar85 * (float)local_aa8;
          fVar135 = (float)local_a88._4_4_ * local_9d8 - fVar108 * (float)local_aa8;
          fVar136 = fStack_a80 * local_9d8 - fVar110 * (float)local_aa8;
          fVar137 = fStack_a7c * local_9d8 - fVar144 * (float)local_aa8;
          local_a98 = CONCAT44(*puVar2,fVar123);
          fVar119 = fVar119 - fVar123;
          fVar123 = fVar123 - (float)*puVar2;
          fVar65 = fVar112 - (float)*puVar3;
          fVar126 = fVar126 - fVar112;
          fVar112 = fVar119 * fVar80 - fVar146 * fVar122;
          fVar111 = fVar123 * fVar82 - fVar148 * fVar124;
          local_8e8._4_4_ = fVar111;
          local_8e8._0_4_ = fVar112;
          fVar59 = fVar65 * fVar97 - fVar150 * fVar125;
          fVar62 = fVar126 * fVar103 - fVar152 * fVar118;
          fStack_9a4 = local_9a8;
          fStack_9a0 = local_9a8;
          fStack_99c = local_9a8;
          fVar92 = fVar92 - local_9a8;
          fVar138 = (float)local_ae8._0_4_ - local_9a8;
          fVar139 = fStack_ad0 - local_9a8;
          fVar140 = local_a68 - local_9a8;
          fVar117 = fVar92 * (float)local_aa8 - (float)local_a88._0_4_ * (float)local_b58;
          fVar127 = fVar138 * (float)local_aa8 - (float)local_a88._4_4_ * (float)local_b58;
          fVar128 = fVar139 * (float)local_aa8 - fStack_a80 * (float)local_b58;
          fVar129 = fVar140 * (float)local_aa8 - fStack_a7c * (float)local_b58;
          fVar147 = fVar52 * fVar122 - fVar119 * fVar141;
          fVar149 = fVar94 * fVar124 - fVar123 * fVar142;
          fVar151 = fVar96 * fVar125 - fVar65 * fVar50;
          fVar153 = fVar66 * fVar118 - fVar126 * fVar57;
          fVar105 = fVar85 * (float)local_b58 - fVar92 * local_9d8;
          fVar107 = fVar108 * (float)local_b58 - fVar138 * local_9d8;
          fVar143 = fVar110 * (float)local_b58 - fVar139 * local_9d8;
          fVar145 = fVar144 * (float)local_b58 - fVar140 * local_9d8;
          local_b58._4_4_ = (float)local_b58;
          fStack_b50 = (float)local_b58;
          fStack_b4c = (float)local_b58;
          fStack_8e0 = fVar59;
          fStack_8dc = fVar62;
          fStack_9d4 = local_9d8;
          fStack_9d0 = local_9d8;
          fStack_9cc = local_9d8;
          local_aa8._4_4_ = (float)local_aa8;
          fStack_aa0 = (float)local_aa8;
          fStack_a9c = (float)local_aa8;
          fVar60 = local_8f8[0] * (float)local_aa8 +
                   fVar112 * local_9d8 + fVar147 * (float)local_b58;
          fVar63 = local_8f8[1] * (float)local_aa8 +
                   fVar111 * local_9d8 + fVar149 * (float)local_b58;
          fVar68 = local_8f8[2] * (float)local_aa8 + fVar59 * local_9d8 + fVar151 * (float)local_b58
          ;
          fVar76 = local_8f8[3] * (float)local_aa8 + fVar62 * local_9d8 + fVar153 * (float)local_b58
          ;
          uVar81 = (uint)fVar60 & 0x80000000;
          uVar83 = (uint)fVar63 & 0x80000000;
          uVar84 = (uint)fVar68 & 0x80000000;
          uVar91 = (uint)fVar76 & 0x80000000;
          fVar122 = (float)((uint)(fVar122 * fVar105 + fVar141 * fVar117 + fVar80 * fVar134) ^
                           uVar81);
          fVar124 = (float)((uint)(fVar124 * fVar107 + fVar142 * fVar127 + fVar82 * fVar135) ^
                           uVar83);
          fVar125 = (float)((uint)(fVar125 * fVar143 + fVar50 * fVar128 + fVar97 * fVar136) ^ uVar84
                           );
          fVar118 = (float)((uint)(fVar118 * fVar145 + fVar57 * fVar129 + fVar103 * fVar137) ^
                           uVar91);
          fVar119 = (float)((uint)(fVar105 * fVar119 + fVar117 * fVar52 + fVar134 * fVar146) ^
                           uVar81);
          fVar123 = (float)((uint)(fVar107 * fVar123 + fVar127 * fVar94 + fVar135 * fVar148) ^
                           uVar83);
          fVar52 = (float)((uint)(fVar143 * fVar65 + fVar128 * fVar96 + fVar136 * fVar150) ^ uVar84)
          ;
          fVar126 = (float)((uint)(fVar145 * fVar126 + fVar129 * fVar66 + fVar137 * fVar152) ^
                           uVar91);
          local_958._0_4_ = ABS(fVar60);
          local_958._4_4_ = ABS(fVar63);
          fStack_950 = ABS(fVar68);
          fStack_94c = ABS(fVar76);
          uVar51 = -(uint)((0.0 <= fVar119 && 0.0 <= fVar122) && fVar60 != 0.0) & local_998._0_4_ &
                   -(uint)(fVar122 + fVar119 <= (float)local_958._0_4_);
          uVar64 = -(uint)((0.0 <= fVar123 && 0.0 <= fVar124) && fVar63 != 0.0) & local_998._4_4_ &
                   -(uint)(fVar124 + fVar123 <= (float)local_958._4_4_);
          uVar69 = -(uint)((0.0 <= fVar52 && 0.0 <= fVar125) && fVar68 != 0.0) & local_998._8_4_ &
                   -(uint)(fVar125 + fVar52 <= fStack_950);
          uVar77 = -(uint)((0.0 <= fVar126 && 0.0 <= fVar118) && fVar76 != 0.0) & local_998._12_4_ &
                   -(uint)(fVar118 + fVar126 <= fStack_94c);
          auVar25._4_4_ = uVar64;
          auVar25._0_4_ = uVar51;
          auVar25._8_4_ = uVar69;
          auVar25._12_4_ = uVar77;
          iVar30 = movmskps((int)lVar40,auVar25);
          auVar53 = *(undefined1 (*) [16])
                     ((long)pRVar33->instID + (uVar45 + lVar40) * (long)p_Var13);
          auVar86 = auVar53._0_12_;
          local_838 = ZEXT416(uVar58);
          local_848 = ZEXT416(uVar61);
          if (iVar30 != 0) {
            auVar130._0_4_ = fVar85 * fVar112 + fVar92 * fVar147;
            auVar130._4_4_ = fVar108 * fVar111 + fVar138 * fVar149;
            auVar130._8_4_ = fVar110 * fVar59 + fVar139 * fVar151;
            auVar130._12_4_ = fVar144 * fVar62 + fVar140 * fVar153;
            local_968 = (float)(uVar81 ^ (uint)((float)local_a88._0_4_ * local_8f8[0] +
                                               auVar130._0_4_));
            fStack_964 = (float)(uVar83 ^ (uint)((float)local_a88._4_4_ * local_8f8[1] +
                                                auVar130._4_4_));
            fStack_960 = (float)(uVar84 ^ (uint)(fStack_a80 * local_8f8[2] + auVar130._8_4_));
            fStack_95c = (float)(uVar91 ^ (uint)(fStack_a7c * local_8f8[3] + auVar130._12_4_));
            fVar85 = (local_b70->org).field_0.m128[3];
            bVar15 = fVar85 * (float)local_958._4_4_ < fStack_964;
            iVar30 = -(uint)bVar15;
            bVar16 = fVar85 * fStack_950 < fStack_960;
            iVar48 = -(uint)bVar16;
            bVar17 = fVar85 * fStack_94c < fStack_95c;
            iVar49 = -(uint)bVar17;
            auVar100._8_4_ = iVar48;
            auVar100._4_4_ = iVar30;
            auVar100._12_4_ = iVar49;
            auVar8._0_4_ = local_b70->tfar;
            auVar8._4_4_ = local_b70->mask;
            auVar8._8_4_ = local_b70->id;
            auVar8._12_4_ = local_b70->flags;
            local_938._0_4_ =
                 -(uint)(local_968 <= (float)auVar8._0_4_ * (float)local_958._0_4_ &&
                        fVar85 * (float)local_958._0_4_ < local_968) & uVar51;
            local_938._4_4_ =
                 -(uint)(fStack_964 <= (float)auVar8._0_4_ * (float)local_958._4_4_ && bVar15) &
                 uVar64;
            local_938._8_4_ =
                 -(uint)(fStack_960 <= (float)auVar8._0_4_ * fStack_950 && bVar16) & uVar69;
            local_938._12_4_ =
                 -(uint)(fStack_95c <= (float)auVar8._0_4_ * fStack_94c && bVar17) & uVar77;
            uVar51 = movmskps((int)pRVar33,local_938);
            pRVar33 = (RTCRayQueryContext *)(ulong)uVar51;
            if (uVar51 != 0) {
              uVar38 = extractps(auVar8,1);
              local_8d8 = CONCAT44(fVar149,fVar147);
              uStack_8d0 = CONCAT44(fVar153,fVar151);
              auVar100._0_4_ = (float)(int)(*(ushort *)(local_ab8 + 8 + lVar36) - 1);
              auVar121._4_4_ = iVar30;
              auVar121._0_4_ = auVar100._0_4_;
              auVar121._8_4_ = iVar48;
              auVar121._12_4_ = iVar49;
              auVar87 = rcpss(auVar121,auVar100);
              auVar131._4_12_ = auVar130._4_12_;
              auVar131._0_4_ = (float)(int)(*(ushort *)(local_ab8 + 10 + lVar36) - 1);
              fStack_97c = (2.0 - auVar100._0_4_ * auVar87._0_4_) * auVar87._0_4_;
              auVar101._4_4_ = auVar130._4_4_;
              auVar101._0_4_ = auVar131._0_4_;
              auVar101._8_4_ = auVar130._8_4_;
              auVar101._12_4_ = auVar130._12_4_;
              auVar87 = rcpss(auVar101,auVar131);
              fStack_96c = (2.0 - auVar131._0_4_ * auVar87._0_4_) * auVar87._0_4_;
              local_988._0_4_ = fStack_97c * ((float)uVar58 * (float)local_958._0_4_ + fVar122);
              local_988._4_4_ =
                   fStack_97c * ((float)(uVar58 + 1) * (float)local_958._4_4_ + fVar124);
              fStack_980 = fStack_97c * ((float)(uVar58 + 1) * fStack_950 + fVar125);
              fStack_97c = fStack_97c * ((float)uVar58 * fStack_94c + fVar118);
              local_978._0_4_ = fStack_96c * ((float)uVar61 * (float)local_958._0_4_ + fVar119);
              local_978._4_4_ = fStack_96c * ((float)uVar61 * (float)local_958._4_4_ + fVar123);
              fStack_970 = fStack_96c * ((float)(uVar61 + 1) * fStack_950 + fVar52);
              fStack_96c = fStack_96c * ((float)(uVar61 + 1) * fStack_94c + fVar126);
              pGVar12 = (local_ab0->geometries).items[local_b60].ptr;
              if ((pGVar12->mask & (uint)uVar38) != 0) {
                pRVar14 = local_b68->args;
                if ((pRVar14->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_006b36d9;
                local_8c8 = auVar53;
                auVar27._4_4_ = local_958._4_4_;
                auVar27._0_4_ = local_958._0_4_;
                auVar27._8_4_ = fStack_950;
                auVar27._12_4_ = fStack_94c;
                auVar53 = rcpps(_local_8e8,auVar27);
                fVar119 = auVar53._0_4_;
                fVar85 = auVar53._4_4_;
                fVar92 = auVar53._8_4_;
                fVar123 = auVar53._12_4_;
                fVar119 = (1.0 - (float)local_958._0_4_ * fVar119) * fVar119 + fVar119;
                fVar85 = (1.0 - (float)local_958._4_4_ * fVar85) * fVar85 + fVar85;
                fVar92 = (1.0 - fStack_950 * fVar92) * fVar92 + fVar92;
                fVar123 = (1.0 - fStack_94c * fVar123) * fVar123 + fVar123;
                local_908[0] = local_968 * fVar119;
                local_908[1] = fStack_964 * fVar85;
                local_908[2] = fStack_960 * fVar92;
                local_908[3] = fStack_95c * fVar123;
                local_928._4_4_ = (float)local_988._4_4_ * fVar85;
                local_928._0_4_ = (float)local_988._0_4_ * fVar119;
                fStack_920 = fStack_980 * fVar92;
                fStack_91c = fStack_97c * fVar123;
                local_918._4_4_ = (float)local_978._4_4_ * fVar85;
                local_918._0_4_ = (float)local_978._0_4_ * fVar119;
                fStack_910 = fStack_970 * fVar92;
                fStack_90c = fStack_96c * fVar123;
                uVar45 = (ulong)(byte)uVar51;
                pRVar37 = (RTCRayQueryContext *)0x0;
                if (uVar45 != 0) {
                  for (; ((byte)uVar51 >> (long)pRVar37 & 1) == 0;
                      pRVar37 = (RTCRayQueryContext *)((long)pRVar37->instID + 1)) {
                  }
                }
                local_aa8 = local_b68->user;
                _local_a88 = auVar8;
                pRVar33 = local_b68->user;
                while (uVar45 != 0) {
                  local_b3c = *(undefined4 *)(local_928 + (long)pRVar37 * 4);
                  local_b38 = local_908[(long)pRVar37[-1].instPrimID];
                  local_b70->tfar = local_908[(long)pRVar37];
                  local_b48 = local_8f8[(long)pRVar37];
                  local_b44 = *(undefined4 *)(local_8e8 + (long)pRVar37 * 4);
                  local_b58 = pRVar37;
                  local_b40 = *(undefined4 *)((long)&local_8d8 + (long)pRVar37 * 4);
                  local_b34 = (undefined4)local_ac0;
                  local_b30 = (undefined4)local_b60;
                  local_b2c = local_aa8->instID[0];
                  local_b28 = local_aa8->instPrimID[0];
                  local_b7c = -1;
                  local_b18.valid = &local_b7c;
                  local_b18.geometryUserPtr = pGVar12->userPtr;
                  local_b18.context = local_aa8;
                  local_b18.ray = (RTCRayN *)local_b70;
                  local_b18.hit = (RTCHitN *)&local_b48;
                  local_b18.N = 1;
                  if (((pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*pGVar12->occlusionFilterN)(&local_b18), *local_b18.valid != 0)) &&
                     ((pRVar14->filter == (RTCFilterFunctionN)0x0 ||
                      ((((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((pGVar12->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*pRVar14->filter)(&local_b18), *local_b18.valid != 0))))))
                  goto LAB_006b36d9;
                  local_b70->tfar = (float)local_a88._0_4_;
                  uVar45 = uVar45 ^ 1L << ((ulong)local_b58 & 0x3f);
                  pRVar37 = (RTCRayQueryContext *)0x0;
                  pRVar33 = local_b58;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> (long)pRVar37 & 1) == 0;
                        pRVar37 = (RTCRayQueryContext *)((long)pRVar37->instID + 1)) {
                    }
                  }
                }
                local_9b8 = (local_b70->org).field_0.m128[0];
                local_9c8 = (local_b70->org).field_0.m128[1];
                local_9a8 = (local_b70->org).field_0.m128[2];
                local_aa8._0_4_ = (local_b70->dir).field_0.m128[0];
                local_9d8 = (local_b70->dir).field_0.m128[1];
                local_b58._0_4_ = (local_b70->dir).field_0.m128[2];
                fStack_9b4 = local_9b8;
                fStack_9b0 = local_9b8;
                fStack_9ac = local_9b8;
                fStack_9c4 = local_9c8;
                fStack_9c0 = local_9c8;
                fStack_9bc = local_9c8;
                fStack_9a4 = local_9a8;
                fStack_9a0 = local_9a8;
                fStack_99c = local_9a8;
                local_aa8._4_4_ = (float)local_aa8;
                fStack_aa0 = (float)local_aa8;
                fStack_a9c = (float)local_aa8;
                fStack_9d4 = local_9d8;
                fStack_9d0 = local_9d8;
                fStack_9cc = local_9d8;
                local_b58._4_4_ = (float)local_b58;
                fStack_b50 = (float)local_b58;
                fStack_b4c = (float)local_b58;
                auVar86 = local_8c8._0_12_;
              }
            }
          }
          fVar144 = fStack_a70;
          fVar126 = fStack_a74;
          fVar123 = local_a78;
          fVar92 = fStack_ad0;
          fVar85 = local_ad8._4_4_;
          fVar119 = (float)local_ad8;
          fVar62 = auVar86._4_4_;
          fVar66 = auVar86._0_4_;
          fVar117 = auVar86._8_4_;
          local_ad8._0_4_ = (float)local_ad8 - (float)local_818;
          fVar112 = local_a78 - local_818._4_4_;
          fStack_ad0 = fVar66 - fStack_810;
          fStack_acc = local_7f8 - fStack_80c;
          local_ad8 = (RTCRayQueryContext *)CONCAT44(fVar112,(float)local_ad8);
          fVar52 = fVar85 - local_808;
          fVar94 = fStack_a74 - fStack_804;
          fVar96 = fVar62 - fStack_800;
          fStack_a6c = fStack_7f4 - fStack_7fc;
          local_a68 = fVar92 - local_a68;
          fStack_a64 = fStack_a70 - fStack_a64;
          fStack_a60 = fVar117 - fStack_a60;
          fStack_a5c = fStack_7f0 - fStack_a5c;
          fVar68 = (float)local_a98 - fVar119;
          fVar76 = local_a98._4_4_ - local_a78;
          fVar80 = fStack_a90 - fVar66;
          fVar82 = fStack_a8c - local_7f8;
          fVar59 = local_7e8 - fVar85;
          fVar65 = fStack_7e4 - fStack_a74;
          fVar127 = fStack_7e0 - fVar62;
          fVar128 = fStack_7dc - fStack_7f4;
          fVar137 = (float)local_ae8._0_4_ - fVar92;
          fVar138 = (float)local_ae8._4_4_ - fStack_a70;
          fVar139 = fStack_ae0 - fVar117;
          fVar140 = fStack_adc - fStack_7f0;
          local_a78 = fVar52;
          fStack_a74 = fVar94;
          fStack_a70 = fVar96;
          local_8f8[0] = fVar59 * local_a68 - fVar137 * fVar52;
          local_8f8[1] = fVar65 * fStack_a64 - fVar138 * fVar94;
          local_8f8[2] = fVar127 * fStack_a60 - fVar139 * fVar96;
          local_8f8[3] = fVar128 * fStack_a5c - fVar140 * fStack_a6c;
          local_8e8._0_4_ = fVar137 * (float)local_ad8 - fVar68 * local_a68;
          local_8e8._4_4_ = fVar138 * fVar112 - fVar76 * fStack_a64;
          fStack_8e0 = fVar139 * fStack_ad0 - fVar80 * fStack_a60;
          fStack_8dc = fVar140 * fStack_acc - fVar82 * fStack_a5c;
          fVar141 = fVar68 * fVar52 - fVar59 * (float)local_ad8;
          fVar142 = fVar76 * fVar94 - fVar65 * fVar112;
          fStack_a90 = fVar80 * fVar96 - fVar127 * fStack_ad0;
          fStack_a8c = fVar82 * fStack_a6c - fVar128 * fStack_acc;
          local_ae8._0_4_ = fVar119 - fStack_9ac;
          local_ae8._4_4_ = fVar123 - fStack_9ac;
          fStack_ae0 = fVar66 - fStack_9ac;
          fStack_adc = local_7f8 - fStack_9ac;
          fVar85 = fVar85 - fStack_9bc;
          fVar126 = fVar126 - fStack_9bc;
          fVar62 = fVar62 - fStack_9bc;
          fVar97 = fStack_7f4 - fStack_9bc;
          fVar92 = fVar92 - fStack_99c;
          fVar144 = fVar144 - fStack_99c;
          fVar117 = fVar117 - fStack_99c;
          fVar103 = fStack_7f0 - fStack_99c;
          fVar129 = fVar85 * local_b58._4_4_ - fVar92 * fStack_9cc;
          fVar122 = fVar126 * local_b58._4_4_ - fVar144 * fStack_9cc;
          fVar124 = fVar62 * local_b58._4_4_ - fVar117 * fStack_9cc;
          fVar125 = fVar97 * local_b58._4_4_ - fVar103 * fStack_9cc;
          fVar118 = fVar92 * local_aa8._4_4_ - (float)local_ae8._0_4_ * local_b58._4_4_;
          fVar134 = fVar144 * local_aa8._4_4_ - (float)local_ae8._4_4_ * local_b58._4_4_;
          fVar135 = fVar117 * local_aa8._4_4_ - fStack_ae0 * local_b58._4_4_;
          fVar136 = fVar103 * local_aa8._4_4_ - fStack_adc * local_b58._4_4_;
          fVar50 = (float)local_ae8._0_4_ * fStack_9cc - fVar85 * local_aa8._4_4_;
          fVar57 = (float)local_ae8._4_4_ * fStack_9cc - fVar126 * local_aa8._4_4_;
          fVar60 = fStack_ae0 * fStack_9cc - fVar62 * local_aa8._4_4_;
          fVar63 = fStack_adc * fStack_9cc - fVar97 * local_aa8._4_4_;
          local_a98 = CONCAT44(fVar142,fVar141);
          fVar119 = local_aa8._4_4_ * local_8f8[0] +
                    fStack_9cc * (float)local_8e8._0_4_ + local_b58._4_4_ * fVar141;
          fVar123 = local_aa8._4_4_ * local_8f8[1] +
                    fStack_9cc * (float)local_8e8._4_4_ + local_b58._4_4_ * fVar142;
          fVar66 = local_aa8._4_4_ * local_8f8[2] +
                   fStack_9cc * fStack_8e0 + local_b58._4_4_ * fStack_a90;
          fVar111 = local_aa8._4_4_ * local_8f8[3] +
                    fStack_9cc * fStack_8dc + local_b58._4_4_ * fStack_a8c;
          uVar51 = (uint)fVar119 & 0x80000000;
          uVar58 = (uint)fVar123 & 0x80000000;
          uVar61 = (uint)fVar66 & 0x80000000;
          uVar64 = (uint)fVar111 & 0x80000000;
          fVar59 = (float)((uint)(fVar68 * fVar129 + fVar59 * fVar118 + fVar137 * fVar50) ^ uVar51);
          fVar65 = (float)((uint)(fVar76 * fVar122 + fVar65 * fVar134 + fVar138 * fVar57) ^ uVar58);
          fVar127 = (float)((uint)(fVar80 * fVar124 + fVar127 * fVar135 + fVar139 * fVar60) ^ uVar61
                           );
          fVar128 = (float)((uint)(fVar82 * fVar125 + fVar128 * fVar136 + fVar140 * fVar63) ^ uVar64
                           );
          auVar99._0_4_ =
               (float)((uint)(fVar129 * (float)local_ad8 + fVar118 * fVar52 + fVar50 * local_a68) ^
                      uVar51);
          auVar99._4_4_ =
               (float)((uint)(fVar122 * fVar112 + fVar134 * fVar94 + fVar57 * fStack_a64) ^ uVar58);
          auVar99._8_4_ =
               (float)((uint)(fVar124 * fStack_ad0 + fVar135 * fVar96 + fVar60 * fStack_a60) ^
                      uVar61);
          auVar99._12_4_ =
               (float)((uint)(fVar125 * fStack_acc + fVar136 * fStack_a6c + fVar63 * fStack_a5c) ^
                      uVar64);
          fVar112 = ABS(fVar119);
          fVar52 = ABS(fVar123);
          local_958 = (undefined1  [8])(CONCAT44(fVar123,fVar119) & 0x7fffffff7fffffff);
          fStack_950 = ABS(fVar66);
          fStack_94c = ABS(fVar111);
          auVar115._0_4_ =
               -(uint)((0.0 <= fVar59 && 0.0 <= auVar99._0_4_) && fVar119 != 0.0) & local_998._0_4_
               & -(uint)(fVar59 + auVar99._0_4_ <= fVar112);
          auVar115._4_4_ =
               -(uint)((0.0 <= fVar65 && 0.0 <= auVar99._4_4_) && fVar123 != 0.0) & local_998._4_4_
               & -(uint)(fVar65 + auVar99._4_4_ <= fVar52);
          auVar115._8_4_ =
               -(uint)((0.0 <= fVar127 && 0.0 <= auVar99._8_4_) && fVar66 != 0.0) & local_998._8_4_
               & -(uint)(fVar127 + auVar99._8_4_ <= fStack_950);
          auVar115._12_4_ =
               -(uint)((0.0 <= fVar128 && 0.0 <= auVar99._12_4_) && fVar111 != 0.0) &
               local_998._12_4_ & -(uint)(fVar128 + auVar99._12_4_ <= fStack_94c);
          iVar30 = movmskps((int)pRVar33,auVar115);
          if (iVar30 != 0) {
            local_968 = (float)(uVar51 ^ (uint)((float)local_ae8._0_4_ * local_8f8[0] +
                                               fVar85 * (float)local_8e8._0_4_ + fVar92 * fVar141));
            fStack_964 = (float)(uVar58 ^ (uint)((float)local_ae8._4_4_ * local_8f8[1] +
                                                fVar126 * (float)local_8e8._4_4_ + fVar144 * fVar142
                                                ));
            fStack_960 = (float)(uVar61 ^ (uint)(fStack_ae0 * local_8f8[2] +
                                                fVar62 * fStack_8e0 + fVar117 * fStack_a90));
            fStack_95c = (float)(uVar64 ^ (uint)(fStack_adc * local_8f8[3] +
                                                fVar97 * fStack_8dc + fVar103 * fStack_a8c));
            fVar119 = (local_b70->org).field_0.m128[3];
            auVar9._0_4_ = local_b70->tfar;
            auVar9._4_4_ = local_b70->mask;
            auVar9._8_4_ = local_b70->id;
            auVar9._12_4_ = local_b70->flags;
            local_938._0_4_ =
                 -(uint)(local_968 <= (float)auVar9._0_4_ * fVar112 && fVar119 * fVar112 < local_968
                        ) & auVar115._0_4_;
            local_938._4_4_ =
                 -(uint)(fStack_964 <= (float)auVar9._0_4_ * fVar52 && fVar119 * fVar52 < fStack_964
                        ) & auVar115._4_4_;
            local_938._8_4_ =
                 -(uint)(fStack_960 <= (float)auVar9._0_4_ * fStack_950 &&
                        fVar119 * fStack_950 < fStack_960) & auVar115._8_4_;
            local_938._12_4_ =
                 -(uint)(fStack_95c <= (float)auVar9._0_4_ * fStack_94c &&
                        fVar119 * fStack_94c < fStack_95c) & auVar115._12_4_;
            uVar51 = movmskps(iVar30,local_938);
            if (uVar51 != 0) {
              uVar38 = extractps(auVar9,1);
              local_8d8 = local_a98;
              uStack_8d0 = CONCAT44(fStack_a8c,fStack_a90);
              auVar116._0_4_ = fVar112 - auVar99._0_4_;
              auVar116._4_4_ = fVar52 - auVar99._4_4_;
              auVar116._8_4_ = fStack_950 - auVar99._8_4_;
              auVar116._12_4_ = fStack_94c - auVar99._12_4_;
              auVar102._4_12_ = auVar99._4_12_;
              auVar102._0_4_ = (float)(int)(*(ushort *)(local_ab8 + 8 + lVar36) - 1);
              auVar132._4_4_ = auVar99._4_4_;
              auVar132._0_4_ = auVar102._0_4_;
              auVar132._8_4_ = auVar99._8_4_;
              auVar132._12_4_ = auVar99._12_4_;
              auVar53 = rcpss(auVar132,auVar102);
              fVar85 = (float)(int)(*(ushort *)(local_ab8 + 10 + lVar36) - 1);
              fVar119 = (2.0 - auVar102._0_4_ * auVar53._0_4_) * auVar53._0_4_;
              auVar133._4_4_ = fVar142;
              auVar133._0_4_ = fVar85;
              auVar133._8_4_ = fStack_a90;
              auVar133._12_4_ = fStack_a8c;
              auVar26._4_4_ = fVar142;
              auVar26._0_4_ = fVar85;
              auVar26._8_4_ = fStack_a90;
              auVar26._12_4_ = fStack_a8c;
              auVar53 = rcpss(auVar133,auVar26);
              fVar85 = (2.0 - fVar85 * auVar53._0_4_) * auVar53._0_4_;
              local_988._0_4_ =
                   fVar119 * ((float)(int)local_838._0_4_ * fVar112 + (fVar112 - fVar59));
              local_988._4_4_ =
                   fVar119 * ((float)(local_838._0_4_ + 1) * fVar52 + (fVar52 - fVar65));
              fStack_980 = fVar119 * ((float)(local_838._0_4_ + 1) * fStack_950 +
                                     (fStack_950 - fVar127));
              fStack_97c = fVar119 * ((float)(int)local_838._0_4_ * fStack_94c +
                                     (fStack_94c - fVar128));
              local_978._0_4_ = fVar85 * ((float)(int)local_848._0_4_ * fVar112 + auVar116._0_4_);
              local_978._4_4_ = fVar85 * ((float)(int)local_848._0_4_ * fVar52 + auVar116._4_4_);
              fStack_970 = fVar85 * ((float)(local_848._0_4_ + 1) * fStack_950 + auVar116._8_4_);
              fStack_96c = fVar85 * ((float)(local_848._0_4_ + 1) * fStack_94c + auVar116._12_4_);
              pGVar12 = (local_ab0->geometries).items[local_b60].ptr;
              if ((pGVar12->mask & (uint)uVar38) != 0) {
                pRVar14 = local_b68->args;
                if ((pRVar14->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006b36d9:
                  local_b70->tfar = -INFINITY;
                  return;
                }
                auVar53 = rcpps(auVar116,_local_958);
                fVar119 = auVar53._0_4_;
                fVar85 = auVar53._4_4_;
                fVar92 = auVar53._8_4_;
                fVar123 = auVar53._12_4_;
                fVar119 = (1.0 - fVar112 * fVar119) * fVar119 + fVar119;
                fVar85 = (1.0 - fVar52 * fVar85) * fVar85 + fVar85;
                fVar92 = (1.0 - fStack_950 * fVar92) * fVar92 + fVar92;
                fVar123 = (1.0 - fStack_94c * fVar123) * fVar123 + fVar123;
                local_908[0] = local_968 * fVar119;
                local_908[1] = fStack_964 * fVar85;
                local_908[2] = fStack_960 * fVar92;
                local_908[3] = fStack_95c * fVar123;
                local_928._0_4_ = (float)local_988._0_4_ * fVar119;
                local_928._4_4_ = (float)local_988._4_4_ * fVar85;
                fStack_920 = fStack_980 * fVar92;
                fStack_91c = fStack_97c * fVar123;
                local_918._0_4_ = (float)local_978._0_4_ * fVar119;
                local_918._4_4_ = (float)local_978._4_4_ * fVar85;
                fStack_910 = fStack_970 * fVar92;
                fStack_90c = fStack_96c * fVar123;
                uVar41 = (ulong)(uVar51 & 0xff);
                uVar45 = 0;
                if (uVar41 != 0) {
                  for (; ((uVar51 & 0xff) >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                  }
                }
                local_ad8 = local_b68->user;
                _local_ae8 = auVar9;
                fStack_b50 = local_b58._4_4_;
                fStack_b4c = local_b58._4_4_;
                fStack_aa0 = local_aa8._4_4_;
                fStack_a9c = local_aa8._4_4_;
                local_9d8 = fStack_9cc;
                fStack_9d4 = fStack_9cc;
                fStack_9d0 = fStack_9cc;
                local_9c8 = fStack_9bc;
                fStack_9c4 = fStack_9bc;
                fStack_9c0 = fStack_9bc;
                local_9b8 = fStack_9ac;
                fStack_9b4 = fStack_9ac;
                fStack_9b0 = fStack_9ac;
                local_9a8 = fStack_99c;
                fStack_9a4 = fStack_99c;
                fStack_9a0 = fStack_99c;
                local_b58._0_4_ = local_b58._4_4_;
                local_aa8._0_4_ = local_aa8._4_4_;
                while (uVar41 != 0) {
                  local_b3c = *(undefined4 *)(local_928 + uVar45 * 4);
                  local_b38 = local_908[uVar45 - 4];
                  local_b70->tfar = local_908[uVar45];
                  local_b48 = local_8f8[uVar45];
                  local_b44 = *(undefined4 *)(local_8e8 + uVar45 * 4);
                  local_b40 = *(undefined4 *)((long)&local_8d8 + uVar45 * 4);
                  local_b34 = (undefined4)local_ac0;
                  local_b30 = (undefined4)local_b60;
                  local_b2c = local_ad8->instID[0];
                  local_b28 = local_ad8->instPrimID[0];
                  local_b7c = -1;
                  local_b18.valid = &local_b7c;
                  local_b18.geometryUserPtr = pGVar12->userPtr;
                  local_b18.context = local_ad8;
                  local_b18.hit = (RTCHitN *)&local_b48;
                  local_b18.N = 1;
                  local_b18.ray = (RTCRayN *)local_b70;
                  if (((pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*pGVar12->occlusionFilterN)(&local_b18), *local_b18.valid != 0)) &&
                     ((pRVar14->filter == (RTCFilterFunctionN)0x0 ||
                      ((((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((pGVar12->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*pRVar14->filter)(&local_b18), *local_b18.valid != 0))))))
                  goto LAB_006b36d9;
                  local_b70->tfar = local_ae8._0_4_;
                  uVar41 = uVar41 ^ 1L << (uVar45 & 0x3f);
                  uVar45 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                }
              }
            }
          }
          uVar46 = local_9e8;
          fVar117 = local_828;
          fVar127 = fStack_824;
          fVar128 = fStack_820;
          fVar129 = fStack_81c;
        }
        uVar39 = local_a50;
        uVar45 = local_a30;
        uVar41 = local_a38;
        uVar42 = local_a40;
        uVar43 = local_a48;
        fVar144 = local_878;
        fVar126 = fStack_874;
        fVar112 = fStack_870;
        fVar52 = fStack_86c;
        fVar92 = local_8a8;
        fVar94 = fStack_8a4;
        fVar96 = fStack_8a0;
        fVar66 = fStack_89c;
        fVar111 = local_8b8;
        fVar59 = fStack_8b4;
        fVar62 = fStack_8b0;
        fVar65 = fStack_8ac;
        fVar118 = local_888;
        fVar122 = fStack_884;
        fVar124 = fStack_880;
        fVar125 = fStack_87c;
        fVar119 = local_858;
        fVar134 = fStack_854;
        fVar135 = fStack_850;
        fVar136 = fStack_84c;
        fVar123 = local_868;
        fVar137 = fStack_864;
        fVar138 = fStack_860;
        fVar139 = fStack_85c;
        fVar85 = local_898;
        fVar140 = fStack_894;
        fVar141 = fStack_890;
        fVar142 = fStack_88c;
      }
      goto LAB_006b26f3;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }